

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O3

QPDFObjectHandle __thiscall QPDF::getObject(QPDF *this,QPDFObjGen og)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  iterator iVar2;
  const_iterator cVar3;
  _Head_base<0UL,_QPDF::Members_*,_false> _Var4;
  key_type in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  long lVar6;
  pair<std::_Rb_tree_iterator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>,_bool> pVar7;
  QPDFObjectHandle QVar8;
  key_type local_48;
  int local_40 [2];
  shared_ptr<QPDFObject> local_38;
  
  local_48 = in_RDX;
  iVar2 = std::
          _Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_QPDF::ObjCache>,_std::_Select1st<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
          ::find((_Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_QPDF::ObjCache>,_std::_Select1st<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
                  *)(*(long *)og + 0x1a8),&local_48);
  lVar6 = *(long *)og;
  if (iVar2._M_node == (_Base_ptr)(lVar6 + 0x1b0)) {
    if (*(char *)(lVar6 + 0x2d4) == '\x01') {
      cVar3 = std::
              _Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_QPDFXRefEntry>,_std::_Select1st<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
              ::find((_Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_QPDFXRefEntry>,_std::_Select1st<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
                      *)(lVar6 + 0x138),&local_48);
      if (cVar3._M_node == (_Base_ptr)(lVar6 + 0x140)) {
        _Var4._M_head_impl = (Members *)operator_new(0x70);
        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&(_Var4._M_head_impl)->log + 8))->
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x100000001;
        *(undefined ***)&(_Var4._M_head_impl)->log = &PTR___Sp_counted_ptr_inplace_002ebaf0;
        *(undefined1 *)((long)&(_Var4._M_head_impl)->tokenizer + 0x28) = 2;
        ((string *)((long)&(_Var4._M_head_impl)->tokenizer + 0x30))->_M_dataplus = (pointer)0x0;
        *(size_type *)((long)&(_Var4._M_head_impl)->tokenizer + 0x38) = 0;
        ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)((long)&(_Var4._M_head_impl)->tokenizer + 0x40))->_M_allocated_capacity = 0;
        *(undefined8 *)((long)&(_Var4._M_head_impl)->tokenizer + 0x48) = 0;
        ((string *)((long)&(_Var4._M_head_impl)->tokenizer + 0x50))->_M_dataplus =
             (pointer)0xffffffffffffffff;
        (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
        _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
        super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl =
             ((Members *)&(_Var4._M_head_impl)->unique_id)._M_head_impl;
        this[1].m._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
        _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
        super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl = _Var4._M_head_impl;
        _Var5._M_pi = extraout_RDX_01;
        goto LAB_00226f88;
      }
      lVar6 = *(long *)og;
    }
    local_38.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x70);
    (local_38.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
    _M_use_count = 1;
    (local_38.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
    _M_weak_count = 1;
    (local_38.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
    _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_002ebaf0;
    *(undefined1 *)
     &local_38.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[4].
      _vptr__Sp_counted_base = 0xd;
    local_38.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[4].
    _M_use_count = 0;
    local_38.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[4].
    _M_weak_count = 0;
    local_38.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[5].
    _vptr__Sp_counted_base = (_func_int **)0x0;
    local_38.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[5].
    _M_use_count = og.obj;
    local_38.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[5].
    _M_weak_count = og.gen;
    local_38.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[6].
    _vptr__Sp_counted_base = (_func_int **)local_48;
    local_38.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[6].
    _M_use_count = -1;
    local_38.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[6].
    _M_weak_count = -1;
    local_38.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         (local_38.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 1)
    ;
    local_40[1] = 0xffffffff;
    local_40[0] = -1;
    pVar7 = std::
            map<QPDFObjGen,QPDF::ObjCache,std::less<QPDFObjGen>,std::allocator<std::pair<QPDFObjGen_const,QPDF::ObjCache>>>
            ::try_emplace<std::shared_ptr<QPDFObject>,int,int>
                      ((map<QPDFObjGen,QPDF::ObjCache,std::less<QPDFObjGen>,std::allocator<std::pair<QPDFObjGen_const,QPDF::ObjCache>>>
                        *)(lVar6 + 0x1a8),&local_48,&local_38,local_40 + 1,local_40);
    _Var5._M_pi = pVar7._8_8_;
    if (local_38.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_38.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
      _Var5._M_pi = extraout_RDX_00;
    }
    (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
    super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
    super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl =
         (Members *)pVar7.first._M_node._M_node[1]._M_parent;
    _Var4._M_head_impl = (Members *)pVar7.first._M_node._M_node[1]._M_left;
  }
  else {
    (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
    super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
    super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl =
         (Members *)iVar2._M_node[1]._M_parent;
    _Var4._M_head_impl = (Members *)iVar2._M_node[1]._M_left;
    _Var5._M_pi = extraout_RDX;
  }
  this[1].m._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
  super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
  super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl = _Var4._M_head_impl;
  if (_Var4._M_head_impl != (Members *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&(_Var4._M_head_impl)->log + 8);
      *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
      UNLOCK();
    }
    else {
      p_Var1 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&(_Var4._M_head_impl)->log + 8);
      *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
    }
  }
LAB_00226f88:
  QVar8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var5._M_pi;
  QVar8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDF::getObject(QPDFObjGen og)
{
    if (auto it = m->obj_cache.find(og); it != m->obj_cache.end()) {
        return {it->second.object};
    } else if (m->parsed && !m->xref_table.count(og)) {
        return QPDFObject::create<QPDF_Null>();
    } else {
        auto result =
            m->obj_cache.try_emplace(og, QPDFObject::create<QPDF_Unresolved>(this, og), -1, -1);
        return {result.first->second.object};
    }
}